

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random.cpp
# Opt level: O1

ostream * rc::operator<<(ostream *os,Random *random)

{
  std::__ostream_insert<char,std::char_traits<char>>(os,"key=",4);
  detail::showValue<unsigned_long,4ul>(&random->m_key,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,", block=",8);
  detail::showValue<unsigned_long,4ul>(&random->m_block,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,", bits=",7);
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(os,", counter=",10);
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(os,", bitsi=",8);
  std::ostream::operator<<((ostream *)os,(uint)random->m_bitsi);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Random &random) {
  os << "key=";
  show(random.m_key, os);
  os << ", block=";
  show(random.m_block, os);
  os << ", bits=" << random.m_bits;
  os << ", counter=" << random.m_counter;
  os << ", bitsi=" << static_cast<int>(random.m_bitsi);
  return os;
}